

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BufferPointerCase::test(BufferPointerCase *this)

{
  TestContext *pTVar1;
  void **ppvVar2;
  undefined1 local_50 [8];
  StateQueryMemoryWriteGuard<void_*> mapPointerState;
  GLvoid *mapPointer;
  StateQueryMemoryWriteGuard<void_*> initialState;
  GLuint bufferId;
  BufferPointerCase *this_local;
  
  initialState.m_postguard._4_4_ = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,
             (GLuint *)((long)&initialState.m_postguard + 4));
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8892,initialState.m_postguard._4_4_);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<void_*> *)&mapPointer);
  ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::operator&
                      ((StateQueryMemoryWriteGuard<void_*> *)&mapPointer);
  glu::CallLogWrapper::glGetBufferPointerv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8892,0x88bd,ppvVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            ((StateQueryMemoryWriteGuard<void_*> *)&mapPointer,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_void__
                      ((StateQueryMemoryWriteGuard *)&mapPointer);
  BufferParamVerifiers::checkPointerEquals(pTVar1,*ppvVar2,(void *)0x0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ApiCase).super_CallLogWrapper,0x8892,8,(void *)0x0,0x88ea);
  mapPointerState.m_postguard =
       glu::CallLogWrapper::glMapBufferRange
                 (&(this->super_ApiCase).super_CallLogWrapper,0x8892,0,8,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<void_*> *)local_50);
  ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::operator&
                      ((StateQueryMemoryWriteGuard<void_*> *)local_50);
  glu::CallLogWrapper::glGetBufferPointerv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8892,0x88bd,ppvVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            ((StateQueryMemoryWriteGuard<void_*> *)local_50,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_void__
                      ((StateQueryMemoryWriteGuard *)local_50);
  BufferParamVerifiers::checkPointerEquals(pTVar1,*ppvVar2,mapPointerState.m_postguard);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,
             (GLuint *)((long)&initialState.m_postguard + 4));
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint bufferId = 0;
		glGenBuffers(1, &bufferId);
		glBindBuffer(GL_ARRAY_BUFFER, bufferId);
		expectError(GL_NO_ERROR);

		StateQueryMemoryWriteGuard<GLvoid*> initialState;
		glGetBufferPointerv(GL_ARRAY_BUFFER, GL_BUFFER_MAP_POINTER, &initialState);
		initialState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, initialState, 0);

		glBufferData(GL_ARRAY_BUFFER, 8, DE_NULL, GL_DYNAMIC_COPY);
		GLvoid* mapPointer = glMapBufferRange(GL_ARRAY_BUFFER, 0, 8, GL_MAP_READ_BIT);
		expectError(GL_NO_ERROR);

		StateQueryMemoryWriteGuard<GLvoid*> mapPointerState;
		glGetBufferPointerv(GL_ARRAY_BUFFER, GL_BUFFER_MAP_POINTER, &mapPointerState);
		mapPointerState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, mapPointerState, mapPointer);

		glDeleteBuffers(1, &bufferId);
		expectError(GL_NO_ERROR);
	}